

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall OpenMD::ZConstraintForceModifier::updateZPos(ZConstraintForceModifier *this)

{
  double dVar1;
  bool bVar2;
  pointer pZVar3;
  long in_RDI;
  iterator i;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *in_stack_ffffffffffffffc8;
  _Self local_20;
  _List_node_base *local_18;
  _List_iterator<OpenMD::ZconstraintMol> local_10 [2];
  
  std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator(local_10);
  local_18 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin(in_stack_ffffffffffffffc8);
  local_10[0]._M_node = local_18;
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   (in_stack_ffffffffffffffc8);
    bVar2 = std::operator!=(local_10,&local_20);
    if (!bVar2) break;
    dVar1 = *(double *)(in_RDI + 0x98);
    pZVar3 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x1864cf);
    (pZVar3->param).zTargetPos = dVar1 + (pZVar3->param).zTargetPos;
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(local_10);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::updateZPos() {
    std::list<ZconstraintMol>::iterator i;
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      i->param.zTargetPos += zconsGap_;
    }
  }